

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

bool __thiscall
soul::ResolutionPass::GenericFunctionResolver::findGenericFunctionTypes
          (GenericFunctionResolver *this,CallOrCast *call,Function *function,
          ArrayView<soul::Type> callerArgumentTypes,TypeArray *resolvedTypes,bool shouldIgnoreErrors
          )

{
  pool_ptr<soul::AST::Expression> pVar1;
  bool bVar2;
  reference ppVar3;
  UnqualifiedName *pUVar4;
  Expression *pEVar5;
  reference this_00;
  VariableDeclaration *pVVar6;
  Type *callerArgumentType;
  Identifier *name;
  Identifier *name_00;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  int local_144;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  Type local_e0;
  undefined1 local_b8 [8];
  Type newMatch;
  pool_ptr<soul::AST::Expression> pStack_98;
  bool anyReferencesInvolved;
  pool_ptr<soul::AST::Expression> paramType;
  size_t i;
  Type resolvedType;
  Identifier wildcardName;
  pool_ref<soul::AST::UnqualifiedName> wildcardToResolve;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  *__range2;
  bool shouldIgnoreErrors_local;
  TypeArray *resolvedTypes_local;
  Function *function_local;
  CallOrCast *call_local;
  GenericFunctionResolver *this_local;
  ArrayView<soul::Type> callerArgumentTypes_local;
  
  callerArgumentTypes_local.s = callerArgumentTypes.e;
  this_local = (GenericFunctionResolver *)callerArgumentTypes.s;
  __end2 = std::
           vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           ::begin(&function->genericWildcards);
  wildcardToResolve.object =
       (UnqualifiedName *)
       std::
       vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
       ::end(&function->genericWildcards);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::UnqualifiedName>_*,_std::vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>_>
                                     *)&wildcardToResolve), bVar2) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::AST::UnqualifiedName>_*,_std::vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>_>
             ::operator*(&__end2);
    wildcardName.name = (string *)ppVar3->object;
    pUVar4 = pool_ref<soul::AST::UnqualifiedName>::operator->
                       ((pool_ref<soul::AST::UnqualifiedName> *)&wildcardName);
    resolvedType.structure.object = (Structure *)(pUVar4->identifier).name;
    Type::Type((Type *)&i);
    for (paramType.object = (Expression *)0x0; pVar1.object = paramType.object,
        pEVar5 = (Expression *)
                 std::
                 vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                 ::size(&function->parameters), pVar1.object < pEVar5;
        paramType.object =
             (Expression *)
             ((long)&((paramType.object)->super_Statement).super_ASTObject._vptr_ASTObject + 1)) {
      this_00 = std::
                vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                ::operator[](&function->parameters,(size_type)paramType.object);
      pVVar6 = pool_ref<soul::AST::VariableDeclaration>::operator->(this_00);
      pStack_98.object = (pVVar6->declaredType).object;
      bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&stack0xffffffffffffff68);
      if (bVar2) {
        newMatch.structure.object._7_1_ = 0;
        pEVar5 = pool_ptr<soul::AST::Expression>::operator*(&stack0xffffffffffffff68);
        callerArgumentType =
             ArrayView<soul::Type>::operator[]
                       ((ArrayView<soul::Type> *)&this_local,(size_t)paramType.object);
        matchParameterAgainstWildcard
                  ((Type *)local_b8,this,pEVar5,callerArgumentType,
                   (Identifier *)&resolvedType.structure,
                   (bool *)((long)&newMatch.structure.object + 7));
        bVar2 = Type::isValid((Type *)local_b8);
        if (bVar2) {
          bVar2 = Type::isReference((Type *)local_b8);
          if (!bVar2) {
            Type::removeConstIfPresent(&local_e0,(Type *)local_b8);
            Type::operator=((Type *)local_b8,&local_e0);
            Type::~Type(&local_e0);
          }
          bVar2 = Type::isValid((Type *)&i);
          if (!bVar2) {
            Type::operator=((Type *)&i,(Type *)local_b8);
            goto LAB_0045ce66;
          }
          bVar2 = Type::isIdentical((Type *)local_b8,(Type *)&i);
          if (bVar2) goto LAB_0045ce66;
          if (!shouldIgnoreErrors) {
            pUVar4 = pool_ref<soul::AST::UnqualifiedName>::operator->
                               ((pool_ref<soul::AST::UnqualifiedName> *)&wildcardName);
            quoteName_abi_cxx11_(&local_140,(soul *)&resolvedType.structure,name);
            std::operator+(&local_120,"Could not find a value for ",&local_140);
            std::operator+(&local_100,&local_120," that satisfies all argument types");
            throwResolutionError
                      (this,call,function,
                       &(pUVar4->super_Expression).super_Statement.super_ASTObject.context,
                       &local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_140);
          }
          callerArgumentTypes_local.e._7_1_ = 0;
          local_144 = 1;
        }
        else {
LAB_0045ce66:
          local_144 = 0;
        }
        Type::~Type((Type *)local_b8);
        if (local_144 == 0) goto LAB_0045ce98;
      }
      else {
LAB_0045ce98:
        local_144 = 0;
      }
      pool_ptr<soul::AST::Expression>::~pool_ptr(&stack0xffffffffffffff68);
      if (local_144 != 0) goto LAB_0045d01f;
    }
    bVar2 = Type::isValid((Type *)&i);
    if (bVar2) {
      ArrayWithPreallocation<soul::Type,_8UL>::push_back(resolvedTypes,(Type *)&i);
      local_144 = 0;
    }
    else {
      if (!shouldIgnoreErrors) {
        pUVar4 = pool_ref<soul::AST::UnqualifiedName>::operator->
                           ((pool_ref<soul::AST::UnqualifiedName> *)&wildcardName);
        quoteName_abi_cxx11_(&local_188,(soul *)&resolvedType.structure,name_00);
        std::operator+(&local_168,"Failed to resolve generic parameter ",&local_188);
        throwResolutionError
                  (this,call,function,
                   &(pUVar4->super_Expression).super_Statement.super_ASTObject.context,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
      }
      callerArgumentTypes_local.e._7_1_ = 0;
      local_144 = 1;
    }
LAB_0045d01f:
    Type::~Type((Type *)&i);
    if (local_144 == 0) {
      local_144 = 0;
    }
    pool_ref<soul::AST::UnqualifiedName>::~pool_ref
              ((pool_ref<soul::AST::UnqualifiedName> *)&wildcardName);
    if (local_144 != 0) goto LAB_0045d07d;
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::UnqualifiedName>_*,_std::vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>_>
    ::operator++(&__end2);
  }
  callerArgumentTypes_local.e._7_1_ = 1;
LAB_0045d07d:
  return (bool)(callerArgumentTypes_local.e._7_1_ & 1);
}

Assistant:

bool findGenericFunctionTypes (AST::CallOrCast& call, AST::Function& function, ArrayView<Type> callerArgumentTypes, AST::TypeArray& resolvedTypes, bool shouldIgnoreErrors)
        {
            for (auto wildcardToResolve : function.genericWildcards)
            {
                auto wildcardName = wildcardToResolve->identifier;
                Type resolvedType;

                for (size_t i = 0; i < function.parameters.size(); ++i)
                {
                    if (auto paramType = function.parameters[i]->declaredType)
                    {
                        bool anyReferencesInvolved = false;
                        auto newMatch = matchParameterAgainstWildcard (*paramType, callerArgumentTypes[i], wildcardName, anyReferencesInvolved);

                        if (newMatch.isValid())
                        {
                            if (! newMatch.isReference())
                                newMatch = newMatch.removeConstIfPresent();

                            if (resolvedType.isValid())
                            {
                                if (! newMatch.isIdentical (resolvedType))
                                {
                                    if (! shouldIgnoreErrors)
                                        throwResolutionError (call, function, wildcardToResolve->context,
                                                              "Could not find a value for " + quoteName (wildcardName) + " that satisfies all argument types");

                                    return false;
                                }
                            }
                            else
                            {
                                resolvedType = newMatch;
                            }
                        }
                    }
                }

                if (! resolvedType.isValid())
                {
                    if (! shouldIgnoreErrors)
                        throwResolutionError (call, function, wildcardToResolve->context,
                                              "Failed to resolve generic parameter " + quoteName (wildcardName));
                    return false;
                }

                resolvedTypes.push_back (resolvedType);
            }

            return true;
        }